

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# default_traits.h
# Opt level: O0

bool __thiscall
charls::default_traits<unsigned_short,_charls::quad<unsigned_short>_>::is_near
          (default_traits<unsigned_short,_charls::quad<unsigned_short>_> *this,
          quad<unsigned_short> lhs,quad<unsigned_short> rhs)

{
  int iVar1;
  bool local_21;
  default_traits<unsigned_short,_charls::quad<unsigned_short>_> *this_local;
  quad<unsigned_short> rhs_local;
  quad<unsigned_short> lhs_local;
  
  rhs_local.super_triplet<unsigned_short>.field_0.v1 = lhs.super_triplet<unsigned_short>.field_0;
  this_local._0_2_ = rhs.super_triplet<unsigned_short>.field_0;
  iVar1 = (uint)rhs_local.super_triplet<unsigned_short>.field_0.v1 - (uint)this_local._0_2_;
  if (iVar1 < 1) {
    iVar1 = -iVar1;
  }
  local_21 = false;
  if (iVar1 <= this->near_lossless) {
    rhs_local.super_triplet<unsigned_short>.field_1.v2 = lhs.super_triplet<unsigned_short>.field_1;
    this_local._2_2_ = rhs.super_triplet<unsigned_short>.field_1;
    iVar1 = (uint)rhs_local.super_triplet<unsigned_short>.field_1.v2 - (uint)this_local._2_2_;
    if (iVar1 < 1) {
      iVar1 = -iVar1;
    }
    local_21 = false;
    if (iVar1 <= this->near_lossless) {
      rhs_local.super_triplet<unsigned_short>.field_2.v3 = lhs.super_triplet<unsigned_short>.field_2
      ;
      this_local._4_2_ = rhs.super_triplet<unsigned_short>.field_2;
      iVar1 = (uint)rhs_local.super_triplet<unsigned_short>.field_2.v3 - (uint)this_local._4_2_;
      if (iVar1 < 1) {
        iVar1 = -iVar1;
      }
      local_21 = false;
      if (iVar1 <= this->near_lossless) {
        rhs_local.field_0 = lhs.field_0;
        this_local._6_2_ = rhs.field_0;
        iVar1 = (uint)rhs_local.field_0.v4 - (uint)this_local._6_2_;
        if (iVar1 < 1) {
          iVar1 = -iVar1;
        }
        local_21 = iVar1 <= this->near_lossless;
      }
    }
  }
  return local_21;
}

Assistant:

bool is_near(const quad<SampleType> lhs, const quad<SampleType> rhs) const noexcept
    {
        return std::abs(lhs.v1 - rhs.v1) <= near_lossless && std::abs(lhs.v2 - rhs.v2) <= near_lossless &&
               std::abs(lhs.v3 - rhs.v3) <= near_lossless && std::abs(lhs.v4 - rhs.v4) <= near_lossless;
    }